

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O0

void leccalc::checkinputfile(uint *samplesize,FILE *fin,aggreports *agg)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_34 [4];
  size_t sStack_30;
  uint summaryset_id;
  size_t i;
  aggreports *paStack_20;
  uint stream_type;
  aggreports *agg_local;
  FILE *fin_local;
  uint *samplesize_local;
  
  i._4_4_ = 0;
  paStack_20 = agg;
  agg_local = (aggreports *)fin;
  fin_local = (FILE *)samplesize;
  sStack_30 = fread((void *)((long)&i + 4),4,1,(FILE *)fin);
  if ((sStack_30 != 1) || (bVar1 = isSummaryCalcStream(i._4_4_), !bVar1)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "FATAL:: Not a summarycalc stream invalid stream type: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,i._4_4_);
    std::operator<<(poVar2,"\n");
    exit(-1);
  }
  sStack_30 = fread(fin_local,4,1,(FILE *)agg_local);
  if (sStack_30 != 1) {
    std::operator<<((ostream *)&std::cerr,"FATAL: Stream read error: samplesize\n");
    exit(-1);
  }
  sStack_30 = fread(local_34,4,1,(FILE *)agg_local);
  if (sStack_30 == 1) {
    if ((checkinputfile::firstFileRead & 1U) == 0) {
      aggreports::SetSampleSize(paStack_20,*(int *)fin_local);
      checkinputfile::firstFileRead = true;
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"FATAL: Stream read error: summaryset_id\n");
  exit(-1);
}

Assistant:

inline void checkinputfile(unsigned int& samplesize, FILE * fin,
				   aggreports &agg)
	{
		static bool firstFileRead = false;

		// read_stream_type()
		unsigned int stream_type = 0;
		size_t i = fread(&stream_type, sizeof(stream_type), 1, fin);
		if (i != 1 || isSummaryCalcStream(stream_type) != true) {
			std::cerr << "FATAL:: Not a summarycalc stream invalid stream type: " << stream_type << "\n";
			exit(-1);
		}

		// read_sample_size()
		i = fread(&samplesize, sizeof(samplesize), 1, fin);
		if (i != 1) {
			std::cerr << "FATAL: Stream read error: samplesize\n";
			exit(-1);
		}

		// read_summary_set_id()
		unsigned int summaryset_id;
		i = fread(&summaryset_id, sizeof(summaryset_id), 1, fin);
		if (i != 1) {
			std::cerr << "FATAL: Stream read error: summaryset_id\n";
			exit(-1);
		}

		if (firstFileRead) return;

		agg.SetSampleSize(samplesize);   // Extract sample size from first file
		firstFileRead = true;
	}